

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psft.c
# Opt level: O0

void cf2_getBlueMetrics(PS_Decoder *decoder,CF2_F16Dot16 *blueScale,CF2_F16Dot16 *blueShift,
                       CF2_F16Dot16 *blueFuzz)

{
  FT_Long FVar1;
  CF2_F16Dot16 *blueFuzz_local;
  CF2_F16Dot16 *blueShift_local;
  CF2_F16Dot16 *blueScale_local;
  PS_Decoder *decoder_local;
  
  FVar1 = FT_DivFix((decoder->current_subfont->private_dict).blue_scale,0x3e80000);
  *blueScale = (CF2_F16Dot16)FVar1;
  *blueShift = (int)(decoder->current_subfont->private_dict).blue_shift << 0x10;
  *blueFuzz = (int)(decoder->current_subfont->private_dict).blue_fuzz << 0x10;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cf2_getBlueMetrics( PS_Decoder*  decoder,
                      CF2_Fixed*   blueScale,
                      CF2_Fixed*   blueShift,
                      CF2_Fixed*   blueFuzz )
  {
    FT_ASSERT( decoder && decoder->current_subfont );

    *blueScale = FT_DivFix(
                   decoder->current_subfont->private_dict.blue_scale,
                   cf2_intToFixed( 1000 ) );
    *blueShift = cf2_intToFixed(
                   decoder->current_subfont->private_dict.blue_shift );
    *blueFuzz  = cf2_intToFixed(
                   decoder->current_subfont->private_dict.blue_fuzz );
  }